

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_streambuf.cpp
# Opt level: O3

ssize_t __thiscall seekable::read(seekable *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  
  uVar2 = this->pos;
  pcVar1 = (this->dev).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->dev).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar1;
  if (((uVar3 < uVar2 + (long)__buf) && (__buf = (void *)(uVar3 - uVar2), uVar3 < uVar2)) ||
     (__buf == (void *)0x0)) {
    __buf = (void *)0x0;
  }
  else {
    memcpy((void *)CONCAT44(in_register_00000034,__fd),pcVar1 + uVar2,(size_t)__buf);
    uVar2 = this->pos;
  }
  this->pos = uVar2 + (long)__buf;
  return (ssize_t)__buf;
}

Assistant:

size_t read(char *p,size_t n)
	{
		if(n + pos > dev.size()) {
			if(pos > dev.size())
				n=0;
			else
				n=dev.size() - pos;
		}
		if(n>0)
			memcpy(p,&dev[pos],n);
		pos+=n;
		return n;
	}